

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O3

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  uint16_t *__dest;
  uint16_t *puVar1;
  wchar_t wVar2;
  uchar *puVar3;
  short sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  htree_t *phVar12;
  byte bVar13;
  wchar_t wVar14;
  ulong uVar15;
  ulong uVar16;
  htree_t *phVar17;
  uint uVar18;
  uint16_t uVar19;
  long lVar20;
  uint16_t *__src;
  wchar_t wVar21;
  ushort uVar22;
  wchar_t wVar23;
  uint16_t *puVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  wchar_t bitptn [17];
  wchar_t weight [17];
  uint auStack_c8 [20];
  uint auStack_78 [18];
  
  uVar8 = 0x8000;
  uVar15 = 0;
  uVar16 = 0;
  uVar18 = 0;
  do {
    auStack_c8[uVar15 + 1] = uVar18;
    auStack_78[uVar15 + 1] = uVar8;
    lVar11 = uVar15 + 1;
    uVar18 = hf->freq[lVar11] * uVar8 + uVar18;
    uVar15 = uVar15 + 1;
    if (hf->freq[lVar11] != L'\0') {
      uVar16 = uVar15 & 0xffffffff;
    }
    uVar8 = uVar8 >> 1;
  } while (uVar15 != 0x10);
  if (uVar18 != 0x10000) {
    return L'\0';
  }
  wVar23 = (wchar_t)uVar16;
  if (hf->tbl_bits < wVar23) {
    return L'\0';
  }
  hf->max_bits = wVar23;
  if (wVar23 < L'\x10') {
    if (L'\0' < wVar23) {
      bVar13 = 0x10 - (char)uVar16;
      uVar15 = 1;
      do {
        auStack_c8[uVar15] = (int)auStack_c8[uVar15] >> (bVar13 & 0x1f);
        auStack_78[uVar15] = (int)auStack_78[uVar15] >> (bVar13 & 0x1f);
        uVar15 = uVar15 + 1;
      } while ((uint)(wVar23 + L'\x01') != uVar15);
      if (L'\n' < wVar23) goto LAB_0058036d;
    }
    puVar24 = hf->tbl;
    wVar23 = L'\0';
  }
  else {
LAB_0058036d:
    wVar23 = wVar23 + L'\xfffffff6';
    lVar11 = 1;
    do {
      auStack_c8[lVar11] = (int)auStack_c8[lVar11] >> ((byte)wVar23 & 0x1f);
      auStack_78[lVar11] = (int)auStack_78[lVar11] >> ((byte)wVar23 & 0x1f);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0xb);
    uVar8 = hf->freq[10] * auStack_78[10] + auStack_c8[10];
    puVar24 = hf->tbl;
    if (uVar8 < 0x400) {
      uVar15 = (ulong)(uVar8 * 2);
      memset((void *)((long)puVar24 + uVar15),0,0x800 - uVar15);
    }
  }
  hf->shift_bits = wVar23;
  puVar3 = hf->bitlen;
  wVar2 = hf->len_avail;
  lVar11 = (long)wVar2;
  hf->tree_used = L'\0';
  if (0 < lVar11) {
    uVar8 = 1 << ((byte)wVar23 - 1 & 0x1f);
    lVar20 = 0;
    do {
      bVar13 = puVar3[lVar20];
      if (bVar13 != 0) {
        uVar16 = (ulong)((uint)bVar13 * 4);
        uVar18 = *(uint *)((long)auStack_c8 + uVar16);
        uVar10 = *(uint *)((long)auStack_78 + uVar16);
        uVar15 = (ulong)uVar10;
        *(uint *)((long)auStack_c8 + uVar16) = uVar10 + uVar18;
        uVar19 = (uint16_t)lVar20;
        if (bVar13 < 0xb) {
          if (0x400 < (int)(uVar10 + uVar18)) {
            return L'\0';
          }
          __dest = puVar24 + (int)uVar18;
          if ((int)uVar10 < 8) {
            if (1 < (int)uVar10) {
              uVar16 = uVar15 + 2;
              do {
                __dest[uVar16 - 3] = uVar19;
                __dest[uVar16 - 4] = uVar19;
                uVar16 = uVar16 - 2;
                uVar10 = (int)uVar15 - 2;
                uVar15 = (ulong)uVar10;
              } while (3 < uVar16);
            }
            if (uVar10 != 0) {
              __dest[(long)(int)uVar10 + -1] = uVar19;
            }
          }
          else {
            uVar15 = (ulong)(uVar10 - 8);
            __src = __dest + uVar15;
            auVar26 = pshuflw(ZEXT416((uint)lVar20),ZEXT416((uint)lVar20),0);
            uVar25 = auVar26._0_4_;
            *(undefined4 *)__src = uVar25;
            *(undefined4 *)(__src + 2) = uVar25;
            *(undefined4 *)(__src + 4) = uVar25;
            *(undefined4 *)(__src + 6) = uVar25;
            if (0xf < uVar10) {
              uVar15 = (ulong)(uVar10 - 0x10);
              puVar1 = __dest + uVar15;
              uVar5 = *(undefined8 *)(__src + 4);
              *(undefined8 *)puVar1 = *(undefined8 *)__src;
              *(undefined8 *)(puVar1 + 4) = uVar5;
              if (0xf < uVar10 - 0x10) {
                do {
                  uVar5 = *(undefined8 *)puVar1;
                  uVar6 = *(undefined8 *)(puVar1 + 4);
                  uVar7 = *(undefined8 *)(puVar1 + 0xc);
                  *(undefined8 *)(puVar24 + (long)(int)uVar18 + (uVar15 - 8)) =
                       *(undefined8 *)(puVar1 + 8);
                  *(undefined8 *)(puVar24 + (long)(int)uVar18 + (uVar15 - 8) + 4) = uVar7;
                  *(undefined8 *)(puVar24 + (long)(int)uVar18 + (uVar15 - 0x10)) = uVar5;
                  *(undefined8 *)(puVar24 + (long)(int)uVar18 + (uVar15 - 0x10) + 4) = uVar6;
                  uVar15 = uVar15 - 0x10;
                } while (0xf < uVar15);
              }
              uVar15 = uVar15 & 0xffffffff;
              __src = puVar1;
            }
            if ((int)uVar15 != 0) {
              memcpy(__dest,__src,uVar15 * 2);
            }
          }
        }
        else {
          iVar9 = (int)uVar18 >> ((byte)wVar23 & 0x1f);
          sVar4 = (short)wVar2;
          if (puVar24[iVar9] == 0) {
            wVar14 = hf->tree_used;
            puVar24[iVar9] = (short)wVar14 + sVar4;
            phVar12 = hf->tree;
            wVar21 = wVar14 + L'\x01';
            hf->tree_used = wVar21;
            if (hf->tree_avail <= wVar14) {
              return L'\0';
            }
            phVar17 = phVar12 + wVar14;
            phVar17->left = 0;
            phVar17->right = 0;
          }
          else {
            wVar14 = (wchar_t)puVar24[iVar9];
            if (wVar14 < wVar2) {
              return L'\0';
            }
            wVar21 = hf->tree_used;
            if (wVar21 + wVar2 <= wVar14) {
              return L'\0';
            }
            phVar12 = hf->tree;
            phVar17 = phVar12 + (wVar14 - wVar2);
          }
          if (bVar13 == 0xb) {
            uVar22 = (ushort)uVar8;
          }
          else {
            iVar9 = bVar13 - 10;
            uVar10 = uVar8;
            do {
              if ((uVar10 & 0xffff & uVar18) == 0) {
                uVar22 = phVar17->right;
                if (wVar2 <= (int)(uint)uVar22) goto LAB_00580591;
                phVar17->right = (short)wVar21 + sVar4;
LAB_00580575:
                hf->tree_used = wVar21 + L'\x01';
                if (hf->tree_avail <= wVar21) {
                  return L'\0';
                }
                phVar17 = phVar12 + wVar21;
                phVar17->left = 0;
                phVar17->right = 0;
                wVar21 = wVar21 + L'\x01';
              }
              else {
                uVar22 = phVar17->left;
                if ((int)(uint)uVar22 < wVar2) {
                  phVar17->left = (short)wVar21 + sVar4;
                  goto LAB_00580575;
                }
LAB_00580591:
                phVar17 = phVar12 + ((ulong)uVar22 - lVar11);
              }
              uVar10 = (uVar10 & 0xffff) >> 1;
              uVar22 = (ushort)uVar10;
              iVar9 = iVar9 + -1;
            } while (1 < iVar9);
          }
          if (((ushort)uVar18 & uVar22) == 0) {
            if (phVar17->right != 0) {
              return L'\0';
            }
            phVar17->right = uVar19;
          }
          else {
            if (phVar17->left != 0) {
              return L'\0';
            }
            phVar17->left = uVar19;
          }
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar11);
  }
  return L'\x01';
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		unsigned htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			if (cnt > 7) {
				uint16_t *pc;

				cnt -= 8;
				pc = &p[cnt];
				pc[0] = (uint16_t)i;
				pc[1] = (uint16_t)i;
				pc[2] = (uint16_t)i;
				pc[3] = (uint16_t)i;
				pc[4] = (uint16_t)i;
				pc[5] = (uint16_t)i;
				pc[6] = (uint16_t)i;
				pc[7] = (uint16_t)i;
				if (cnt > 7) {
					cnt -= 8;
					memcpy(&p[cnt], pc,
						8 * sizeof(uint16_t));
					pc = &p[cnt];
					while (cnt > 15) {
						cnt -= 16;
						memcpy(&p[cnt], pc,
							16 * sizeof(uint16_t));
					}
				}
				if (cnt)
					memcpy(p, pc, cnt * sizeof(uint16_t));
			} else {
				while (cnt > 1) {
					p[--cnt] = (uint16_t)i;
					p[--cnt] = (uint16_t)i;
				}
				if (cnt)
					p[--cnt] = (uint16_t)i;
			}
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}